

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m3x3.cpp
# Opt level: O3

void M3x3_Transpose(double (*m) [3])

{
  double dVar1;
  bool bVar2;
  long lVar3;
  bool bVar4;
  double (*padVar5) [3];
  double *pdVar6;
  long lVar7;
  long lVar8;
  
  padVar5 = m + 1;
  lVar3 = 0;
  lVar7 = 0;
  bVar2 = true;
  do {
    bVar4 = bVar2;
    pdVar6 = *padVar5 + lVar7;
    lVar8 = lVar3;
    do {
      dVar1 = m[lVar7][lVar8 + 1];
      m[lVar7][lVar8 + 1] = *pdVar6;
      *pdVar6 = dVar1;
      lVar8 = lVar8 + 1;
      pdVar6 = pdVar6 + 3;
    } while (lVar8 != 2);
    lVar3 = lVar3 + 1;
    padVar5 = padVar5 + 1;
    lVar7 = 1;
    bVar2 = false;
  } while (bVar4);
  return;
}

Assistant:

void M3x3_Transpose(double m[3][3])
{
   int i, j;
   double temp;

    for (i=0 ; i<2 ; i++)
    {
        for (j=i+1 ; j<3 ; j++)
        {
            temp   = m[i][j];
            m[i][j] = m[j][i];
            m[j][i] = temp;
        }
    }
}